

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O2

void display_message(game_event_type unused,game_event_data *data,void *user)

{
  char *pcVar1;
  char cVar2;
  wchar_t wVar3;
  byte bVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  wchar_t wVar8;
  ulong uVar9;
  ulong uVar10;
  wchar_t *h_00;
  char *pcVar11;
  wchar_t w;
  wchar_t h;
  char buf [1024];
  
  if (data != (game_event_data *)0x0) {
    wVar3 = (data->message).type;
    if (wVar3 == L'\x1a' && Term != (term *)0x0) {
      Term_xtra(L'\a',L'\0');
      return;
    }
    pcVar11 = data->string;
    if ((pcVar11 != (char *)0x0 && Term != (term *)0x0) && (character_generated)) {
      h_00 = &h;
      Term_get_size(&w,h_00);
      if (msg_flag == false) {
        message_column = L'\0';
      }
      wVar8 = message_column;
      sVar5 = strlen(pcVar11);
      if ((wVar8 != L'\0') && (w + L'\xfffffff8' < wVar8 + (int)sVar5)) {
        if (w + L'\xfffffff8' < wVar8) {
          msg_flush_split_existing(w,h_00);
        }
        else {
          msg_flush(wVar8);
          message_column = L'\0';
        }
        msg_flag = false;
      }
      if ((int)sVar5 < 0x3e9) {
        my_strcpy(buf,pcVar11,0x400);
        bVar4 = message_type_color((uint16_t)wVar3);
        pcVar11 = buf;
        while (wVar3 = (wchar_t)sVar5, w <= message_column + wVar3) {
          uVar7 = (w - message_column) - 8;
          uVar9 = (ulong)uVar7;
          if ((int)uVar7 < 1) {
            uVar9 = 0;
          }
          uVar7 = w / 2 - message_column;
          uVar10 = uVar9;
          uVar6 = (ulong)uVar7;
          if ((int)uVar7 < 1) {
            uVar6 = 0;
          }
          do {
            if ((long)uVar10 <= (long)uVar6) goto LAB_001c4333;
            uVar10 = uVar10 - 1;
          } while (pcVar11[uVar10 & 0xffffffff] != ' ');
          uVar9 = uVar10 & 0xffffffff;
LAB_001c4333:
          wVar8 = (wchar_t)uVar9;
          pcVar1 = pcVar11 + wVar8;
          cVar2 = *pcVar1;
          *pcVar1 = '\0';
          Term_putstr(message_column,L'\0',wVar8,(uint)bVar4,pcVar11);
          msg_flush(wVar8 + message_column + L'\x01');
          *pcVar1 = cVar2;
          message_column = L'\0';
          pcVar1[-1] = ' ';
          pcVar11 = pcVar1 + -1;
          sVar5 = (size_t)(uint)(wVar3 - (wVar8 + L'\xffffffff'));
        }
        Term_putstr(message_column,L'\0',wVar3,(uint)bVar4,pcVar11);
        msg_flag = true;
        message_column = message_column + wVar3 + L'\x01';
      }
    }
  }
  return;
}

Assistant:

void display_message(game_event_type unused, game_event_data *data, void *user)
{
	int n;
	char *t;
	char buf[1024];
	uint8_t color;
	int w, h;

	int type;
	const char *msg;

	if (!data) return;

	type = data->message.type;
	msg = data->message.msg;

	if (Term && type == MSG_BELL) {
		Term_xtra(TERM_XTRA_NOISE, 0);
		return;
	}

	if (!msg || !Term || !character_generated)
		return;

	/* Obtain the size */
	(void)Term_get_size(&w, &h);

	/* Hack -- Reset */
	if (!msg_flag) message_column = 0;

	/* Message Length */
	n = (msg ? strlen(msg) : 0);

	/* Hack -- flush when requested or needed */
	if (message_column && (!msg || ((message_column + n) > (w - 8)))) {
		/* Flush */
		if (message_column <= w - 8) {
			msg_flush(message_column);
			message_column = 0;
		} else {
			msg_flush_split_existing(w, &message_column);
		}

		/* Forget it */
		msg_flag = false;
	}

	/* No message */
	if (!msg) return;

	/* Paranoia */
	if (n > 1000) return;

	/* Copy it */
	my_strcpy(buf, msg, sizeof(buf));

	/* Analyze the buffer */
	t = buf;

	/* Get the color of the message */
	color = message_type_color(type);

	/* Split message */
	while (message_column + n > w - 1) {
		/* Default split */
		int split = MAX(w - 8 - message_column, 0);
		int check = split;
		char oops;

		/* Find the rightmost split point */
		while (check > MAX(w / 2 - message_column, 0)) {
			--check;
			if (t[check] == ' ') {
				split = check;
				break;
			}
		}

		/* Save the split character */
		oops = t[split];

		/* Split the message */
		t[split] = '\0';

		/* Display part of the message */
		Term_putstr(message_column, 0, split, color, t);

		/* Flush it */
		msg_flush(message_column + split + 1);

		/* Restore the split character */
		t[split] = oops;

		/* Insert a space */
		t[--split] = ' ';

		/* Prepare to recurse on the rest of "buf" */
		t += split; n -= split; message_column = 0;
	}

	/* Display the tail of the message */
	Term_putstr(message_column, 0, n, color, t);

	/* Remember the message */
	msg_flag = true;

	/* Remember the position */
	message_column += n + 1;
}